

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O1

string * __thiscall
IRT::getBlockLabel_abi_cxx11_(string *__return_storage_ptr__,IRT *this,CStatementList *basicBlock)

{
  __uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> _Var1;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar2;
  CLabelStatement *this_00;
  CLabel local_30;
  
  if (this == (IRT *)0x0) {
    __assert_fail("basicBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x40,"std::string IRT::getBlockLabel(const CStatementList *)");
  }
  pvVar2 = CStatementList::Statements((CStatementList *)this);
  if ((pvVar2->
      super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (pvVar2->
      super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pvVar2 = CStatementList::Statements((CStatementList *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
         (((pvVar2->
           super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
         _M_t;
    if ((_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
        _Var1._M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl == (CStatement *)0x0) {
      this_00 = (CLabelStatement *)0x0;
    }
    else {
      this_00 = (CLabelStatement *)
                __dynamic_cast(_Var1._M_t.
                               super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                               .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl,
                               &CStatement::typeinfo,&CLabelStatement::typeinfo,0);
    }
    if (this_00 != (CLabelStatement *)0x0) {
      CLabelStatement::Label(&local_30,this_00);
      CLabel::ToString_abi_cxx11_(__return_storage_ptr__,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30.label._M_dataplus._M_p != &local_30.label.field_2) {
        operator_delete(local_30.label._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
    __assert_fail("label != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x44,"std::string IRT::getBlockLabel(const CStatementList *)");
  }
  __assert_fail("basicBlock->Statements().size() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                ,0x41,"std::string IRT::getBlockLabel(const CStatementList *)");
}

Assistant:

std::string getBlockLabel(const CStatementList *basicBlock) {
        assert(basicBlock != nullptr);
        assert(basicBlock->Statements().size() != 0);
        const CStatement* firstStm = basicBlock->Statements().front().get();
        const CLabelStatement* label = dynamic_cast<const CLabelStatement*>(firstStm);
        assert(label != nullptr);

        return label->Label().ToString();
    }